

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  UInt64 value;
  Value *this_00;
  byte *pbVar5;
  ulong uVar6;
  Value local_90;
  Value local_68;
  Value local_40;
  
  cVar1 = *token->start_;
  value = 0;
  if (cVar1 == '-') {
    uVar4 = 0x8000000000000000;
  }
  else {
    uVar4 = 0xffffffffffffffff;
  }
  pbVar5 = (byte *)(token->start_ + (cVar1 == '-'));
  while( true ) {
    if (token->end_ <= pbVar5) {
      if (cVar1 == '-') {
        Value::Value(&local_40,-value);
        Value::operator=(decoded,&local_40);
        this_00 = &local_40;
      }
      else if (value < 0x80000000) {
        Value::Value(&local_68,value);
        Value::operator=(decoded,&local_68);
        this_00 = &local_68;
      }
      else {
        Value::Value(&local_90,value);
        Value::operator=(decoded,&local_90);
        this_00 = &local_90;
      }
      Value::~Value(this_00);
      return true;
    }
    bVar2 = *pbVar5;
    if ((byte)(bVar2 - 0x3a) < 0xf6) break;
    pbVar5 = pbVar5 + 1;
    uVar6 = (ulong)(bVar2 - 0x30);
    if ((uVar4 / 10 <= value) &&
       (((uVar4 / 10 < value || (pbVar5 != (byte *)token->end_)) || (uVar4 % 10 < uVar6)))) break;
    value = value * 10 + uVar6;
  }
  bVar3 = decodeDouble(this,token,decoded);
  return bVar3;
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(c - '0');
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}